

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

void __thiscall
embree::SceneGraph::AnimatedPerspectiveCameraNode::print
          (AnimatedPerspectiveCameraNode *this,ostream *cout,int depth)

{
  PerspectiveCameraNode *pPVar1;
  int iVar2;
  ostream *poVar3;
  ulong uVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>(cout,"AnimatedPerspectiveCameraNode @ ",0x20);
  poVar3 = std::ostream::_M_insert<void_const*>(cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," { ",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  iVar2 = std::__cxx11::string::compare
                    ((char *)&(this->super_PerspectiveCameraNode).super_Node.name);
  if (iVar2 != 0) {
    if (-1 < depth) {
      iVar2 = depth + 1;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(cout,"  ",2);
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(cout,"name = ",7);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (cout,(this->super_PerspectiveCameraNode).super_Node.name._M_dataplus._M_p,
                        (this->super_PerspectiveCameraNode).super_Node.name._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  if ((this->cameras).
      super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->cameras).
      super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar4 = 0;
    do {
      iVar2 = depth + 1;
      if (-1 < depth) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>(cout,"  ",2);
          iVar2 = iVar2 + -1;
        } while (iVar2 != 0);
      }
      pPVar1 = (this->cameras).
               super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar4].ptr;
      (**(code **)((long)(pPVar1->super_Node).super_RefCount._vptr_RefCount + 0x20))
                (pPVar1,cout,depth + 1);
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)(this->cameras).
                                   super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->cameras).
                                   super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (0 < depth) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(cout,"  ",2);
      depth = depth + -1;
    } while (depth != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(cout,"}",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)cout + -0x18) + (char)cout);
  std::ostream::put((char)cout);
  std::ostream::flush();
  return;
}

Assistant:

void SceneGraph::AnimatedPerspectiveCameraNode::print(std::ostream& cout, int depth) {
    cout << "AnimatedPerspectiveCameraNode @ " << this << " { " << std::endl;
    if (name != "") {
      tab(cout, depth+1); cout << "name = " << name << std::endl;
    }
    for (size_t i=0; i<cameras.size(); i++) {
      tab(cout,depth+1); cameras[i]->print(cout,depth+1);
    }
    tab(cout, depth); cout << "}" << std::endl;
  }